

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

void visit_compound_stmt(gvisitor_t *self,gnode_compound_stmt_t *node)

{
  long *plVar1;
  size_t sVar2;
  symboltable_t *table;
  gnode_t *pgVar3;
  ulong uVar4;
  
  plVar1 = *self->data;
  if ((plVar1 == (long *)0x0) || (*plVar1 == 0)) {
    pgVar3 = (gnode_t *)0x0;
  }
  else {
    pgVar3 = *(gnode_t **)(plVar1[2] + -8 + *plVar1 * 8);
  }
  table = symtable_from_node(pgVar3);
  if (table != (symboltable_t *)0x0) {
    symboltable_enter_scope(table);
    if ((node->stmts != (gnode_r *)0x0) && (sVar2 = node->stmts->n, sVar2 != 0)) {
      uVar4 = 0;
      do {
        if (uVar4 < node->stmts->n) {
          pgVar3 = node->stmts->p[uVar4];
        }
        else {
          pgVar3 = (gnode_t *)0x0;
        }
        gvisit(self,pgVar3);
        uVar4 = uVar4 + 1;
      } while (sVar2 != uVar4);
    }
    symboltable_exit_scope(table,&node->nclose);
    return;
  }
  return;
}

Assistant:

static void visit_compound_stmt (gvisitor_t *self, gnode_compound_stmt_t *node) {
    DEBUG_CODEGEN("visit_compound_stmt");

    gnode_array_each(node->stmts, {
        visit(val);

        // check if context is a function
        DECLARE_CONTEXT();
        bool is_func_ctx = OBJECT_ISA_FUNCTION(context_object);
        if (!is_func_ctx) continue;

        // in case of function context cleanup temporary registers
        gravity_function_t *f = (gravity_function_t*)context_object;
        ircode_t *code = (ircode_t *)f->bytecode;
        ircode_register_temps_clear(code);
    });

    if (node->nclose != UINT32_MAX) {
        DECLARE_CODE();
		ircode_add(code, CLOSE, node->nclose, 0, 0, LINE_NUMBER(node));
    }
}